

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RandomNormalStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomnormalstatic(NeuralNetworkLayer *this)

{
  bool bVar1;
  RandomNormalStaticLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_randomnormalstatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_randomnormalstatic(this);
    this_00 = (RandomNormalStaticLayerParams *)operator_new(0x40);
    RandomNormalStaticLayerParams::RandomNormalStaticLayerParams(this_00);
    (this->layer_).randomnormalstatic_ = this_00;
  }
  return (RandomNormalStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomNormalStaticLayerParams* NeuralNetworkLayer::mutable_randomnormalstatic() {
  if (!has_randomnormalstatic()) {
    clear_layer();
    set_has_randomnormalstatic();
    layer_.randomnormalstatic_ = new ::CoreML::Specification::RandomNormalStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomNormalStatic)
  return layer_.randomnormalstatic_;
}